

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_ssl_cf_is_proxy(Curl_cfilter *cf)

{
  Curl_cfilter *cf_local;
  
  return cf->cft == &Curl_cft_ssl_proxy;
}

Assistant:

bool Curl_ssl_cf_is_proxy(struct Curl_cfilter *cf)
{
#ifndef CURL_DISABLE_PROXY
  return (cf->cft == &Curl_cft_ssl_proxy);
#else
  (void)cf;
  return FALSE;
#endif
}